

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_read_plain(curl_socket_t sockfd,char *buf,size_t bytesfromsocket,ssize_t *n)

{
  ssize_t sVar1;
  int *piVar2;
  CURLcode CVar3;
  
  CVar3 = CURLE_OK;
  sVar1 = recv(sockfd,buf,bytesfromsocket,0);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    CVar3 = CURLE_RECV_ERROR;
    if (*piVar2 == 4) {
      CVar3 = CURLE_AGAIN;
    }
    if (*piVar2 == 0xb) {
      CVar3 = CURLE_AGAIN;
    }
  }
  else {
    *n = sVar1;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_read_plain(curl_socket_t sockfd,
                         char *buf,
                         size_t bytesfromsocket,
                         ssize_t *n)
{
  ssize_t nread = sread(sockfd, buf, bytesfromsocket);

  if(-1 == nread) {
    int err = SOCKERRNO;
    int return_error;
#ifdef USE_WINSOCK
    return_error = WSAEWOULDBLOCK == err;
#else
    return_error = EWOULDBLOCK == err || EAGAIN == err || EINTR == err;
#endif
    if(return_error)
      return CURLE_AGAIN;
    else
      return CURLE_RECV_ERROR;
  }

  /* we only return number of bytes read when we return OK */
  *n = nread;
  return CURLE_OK;
}